

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

bool CreateStore(ExpressionEvalContext *ctx,ExprBase *target,ExprBase *value)

{
  bool bVar1;
  uint uVar2;
  StackFrame **ppSVar3;
  ExprFunctionLiteral *pEVar4;
  ExprPointerLiteral *pEVar5;
  TypeRef *pTVar6;
  ExprMemoryLiteral *pEVar7;
  int local_b8;
  int local_b4;
  ExprMemoryLiteral *expr_9;
  TypeRef *ptrType;
  ExprPointerLiteral *expr_8;
  ExprPointerLiteral *context;
  uint index_2;
  ExprFunctionLiteral *expr_7;
  ExprFunctionIndexLiteral *pEStack_78;
  uint index_1;
  ExprFunctionIndexLiteral *expr_6;
  ExprTypeLiteral *pEStack_68;
  uint index;
  ExprTypeLiteral *expr_5;
  ExprRationalLiteral *pEStack_58;
  float tmp;
  ExprRationalLiteral *expr_4;
  ExprIntegerLiteral *expr_3;
  ExprStringLiteral *expr_2;
  ExprCharacterLiteral *expr_1;
  ExprBoolLiteral *expr;
  ExprPointerLiteral *ptr;
  ExprBase *value_local;
  ExprBase *target_local;
  ExpressionEvalContext *ctx_local;
  
  ptr = (ExprPointerLiteral *)value;
  value_local = target;
  target_local = (ExprBase *)ctx;
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar3 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back
                          ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)
                           &target_local->next), (*ppSVar3)->targetYield != 0)) {
    __assert_fail("ctx.stackFrames.back()->targetYield == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x79,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
  }
  bVar1 = isType<ExprNullptrLiteral>(value_local);
  if (bVar1) {
    Report((ExpressionEvalContext *)target_local,"ERROR: store to null pointer");
    ctx_local._7_1_ = false;
  }
  else {
    expr = (ExprBoolLiteral *)getType<ExprPointerLiteral>(value_local);
    if ((ExprPointerLiteral *)expr == (ExprPointerLiteral *)0x0) {
      __assert_fail("ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x84,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
    }
    if (((ExprPointerLiteral *)expr)->end <
        ((ExprPointerLiteral *)expr)->ptr + ((ptr->super_ExprBase).type)->size) {
      __assert_fail("ptr->ptr + value->type->size <= ptr->end",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x85,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
    }
    expr_1 = (ExprCharacterLiteral *)getType<ExprBoolLiteral>(&ptr->super_ExprBase);
    if (expr_1 == (ExprCharacterLiteral *)0x0) {
      expr_2 = (ExprStringLiteral *)getType<ExprCharacterLiteral>(&ptr->super_ExprBase);
      if (expr_2 == (ExprStringLiteral *)0x0) {
        expr_3 = (ExprIntegerLiteral *)getType<ExprStringLiteral>(&ptr->super_ExprBase);
        if ((ExprStringLiteral *)expr_3 == (ExprStringLiteral *)0x0) {
          expr_4 = (ExprRationalLiteral *)getType<ExprIntegerLiteral>(&ptr->super_ExprBase);
          if (expr_4 == (ExprRationalLiteral *)0x0) {
            pEStack_58 = getType<ExprRationalLiteral>(&ptr->super_ExprBase);
            if (pEStack_58 == (ExprRationalLiteral *)0x0) {
              pEStack_68 = getType<ExprTypeLiteral>(&ptr->super_ExprBase);
              if (pEStack_68 == (ExprTypeLiteral *)0x0) {
                bVar1 = isType<ExprNullptrLiteral>(&ptr->super_ExprBase);
                if (bVar1) {
                  memset(expr[1].super_ExprBase._vptr_ExprBase,0,
                         ((ptr->super_ExprBase).type)->size & 0xffffffff);
                  ctx_local._7_1_ = true;
                }
                else {
                  pEStack_78 = getType<ExprFunctionIndexLiteral>(&ptr->super_ExprBase);
                  if (pEStack_78 == (ExprFunctionIndexLiteral *)0x0) {
                    pEVar4 = getType<ExprFunctionLiteral>(&ptr->super_ExprBase);
                    if (pEVar4 == (ExprFunctionLiteral *)0x0) {
                      pEVar5 = getType<ExprPointerLiteral>(&ptr->super_ExprBase);
                      if (pEVar5 == (ExprPointerLiteral *)0x0) {
                        pEVar7 = getType<ExprMemoryLiteral>(&ptr->super_ExprBase);
                        if (pEVar7 == (ExprMemoryLiteral *)0x0) {
                          Report((ExpressionEvalContext *)target_local,"ERROR: unknown store type");
                          ctx_local._7_1_ = false;
                        }
                        else {
                          memcpy(expr[1].super_ExprBase._vptr_ExprBase,pEVar7->ptr->ptr,
                                 ((ptr->super_ExprBase).type)->size & 0xffffffff);
                          ctx_local._7_1_ = true;
                        }
                      }
                      else {
                        pTVar6 = getType<TypeRef>((pEVar5->super_ExprBase).type);
                        if (pTVar6 == (TypeRef *)0x0) {
                          __assert_fail("ptrType",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                                        ,0xda,
                                        "bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)"
                                       );
                        }
                        if (pEVar5->end < pEVar5->ptr + pTVar6->subType->size) {
                          __assert_fail("expr->ptr + ptrType->subType->size <= expr->end",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                                        ,0xdb,
                                        "bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)"
                                       );
                        }
                        memcpy(expr[1].super_ExprBase._vptr_ExprBase,&pEVar5->ptr,
                               ((ptr->super_ExprBase).type)->size & 0xffffffff);
                        ctx_local._7_1_ = true;
                      }
                    }
                    else {
                      if (pEVar4->data == (FunctionData *)0x0) {
                        local_b8 = 0;
                      }
                      else {
                        uVar2 = ExpressionContext::GetFunctionIndex
                                          ((ExpressionContext *)target_local->_vptr_ExprBase,
                                           pEVar4->data);
                        local_b8 = uVar2 + 1;
                      }
                      *(int *)expr[1].super_ExprBase._vptr_ExprBase = local_b8;
                      bVar1 = isType<ExprNullptrLiteral>(pEVar4->context);
                      if (bVar1) {
                        memset((void *)((long)expr[1].super_ExprBase._vptr_ExprBase + 4),0,8);
                      }
                      else {
                        pEVar5 = getType<ExprPointerLiteral>(pEVar4->context);
                        if (pEVar5 == (ExprPointerLiteral *)0x0) {
                          return false;
                        }
                        *(uchar **)((long)expr[1].super_ExprBase._vptr_ExprBase + 4) = pEVar5->ptr;
                      }
                      ctx_local._7_1_ = true;
                    }
                  }
                  else {
                    if (pEStack_78->function == (FunctionData *)0x0) {
                      local_b4 = 0;
                    }
                    else {
                      uVar2 = ExpressionContext::GetFunctionIndex
                                        ((ExpressionContext *)target_local->_vptr_ExprBase,
                                         pEStack_78->function);
                      local_b4 = uVar2 + 1;
                    }
                    expr_7._4_4_ = local_b4;
                    memcpy(expr[1].super_ExprBase._vptr_ExprBase,(void *)((long)&expr_7 + 4),
                           ((ptr->super_ExprBase).type)->size & 0xffffffff);
                    ctx_local._7_1_ = true;
                  }
                }
              }
              else {
                bVar1 = isType<TypeError>(pEStack_68->value);
                if (bVar1) {
                  ctx_local._7_1_ = false;
                }
                else {
                  bVar1 = isType<TypeArgumentSet>(pEStack_68->value);
                  if ((bVar1) || (bVar1 = isType<TypeMemberSet>(pEStack_68->value), bVar1)) {
                    ctx_local._7_1_ = false;
                  }
                  else {
                    expr_6._4_4_ = ExpressionContext::GetTypeIndex
                                             ((ExpressionContext *)target_local->_vptr_ExprBase,
                                              pEStack_68->value);
                    memcpy(expr[1].super_ExprBase._vptr_ExprBase,(void *)((long)&expr_6 + 4),
                           ((ptr->super_ExprBase).type)->size & 0xffffffff);
                    ctx_local._7_1_ = true;
                  }
                }
              }
            }
            else if ((pEStack_58->super_ExprBase).type ==
                     (TypeBase *)target_local->_vptr_ExprBase[0x113d]) {
              expr_5._4_4_ = (float)pEStack_58->value;
              memcpy(expr[1].super_ExprBase._vptr_ExprBase,(void *)((long)&expr_5 + 4),
                     ((ptr->super_ExprBase).type)->size & 0xffffffff);
              ctx_local._7_1_ = true;
            }
            else {
              memcpy(expr[1].super_ExprBase._vptr_ExprBase,&pEStack_58->value,
                     ((ptr->super_ExprBase).type)->size & 0xffffffff);
              ctx_local._7_1_ = true;
            }
          }
          else {
            memcpy(expr[1].super_ExprBase._vptr_ExprBase,&expr_4->value,
                   ((ptr->super_ExprBase).type)->size & 0xffffffff);
            ctx_local._7_1_ = true;
          }
        }
        else {
          memcpy(expr[1].super_ExprBase._vptr_ExprBase,((ExprStringLiteral *)expr_3)->value,
                 ((ptr->super_ExprBase).type)->size & 0xffffffff);
          ctx_local._7_1_ = true;
        }
      }
      else {
        memcpy(expr[1].super_ExprBase._vptr_ExprBase,&(expr_2->super_ExprBase).field_0x29,
               ((ptr->super_ExprBase).type)->size & 0xffffffff);
        ctx_local._7_1_ = true;
      }
    }
    else {
      memcpy(expr[1].super_ExprBase._vptr_ExprBase,
             &(((ExprBoolLiteral *)expr_1)->super_ExprBase).field_0x29,
             ((ptr->super_ExprBase).type)->size & 0xffffffff);
      ctx_local._7_1_ = true;
    }
  }
  return ctx_local._7_1_;
}

Assistant:

bool CreateStore(ExpressionEvalContext &ctx, ExprBase *target, ExprBase *value)
{
	// No side-effects while coroutine is skipping to target node
	if(!ctx.stackFrames.empty())
		assert(ctx.stackFrames.back()->targetYield == 0);

	if(isType<ExprNullptrLiteral>(target))
	{
		Report(ctx, "ERROR: store to null pointer");

		return false;
	}

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(target);

	assert(ptr);
	assert(ptr->ptr + value->type->size <= ptr->end);

	if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(value))
	{
		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprCharacterLiteral *expr = getType<ExprCharacterLiteral>(value))
	{
		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprStringLiteral *expr = getType<ExprStringLiteral>(value))
	{
		memcpy(ptr->ptr, expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(value))
	{
		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(value))
	{
		if(expr->type == ctx.ctx.typeFloat)
		{
			float tmp = float(expr->value);
			memcpy(ptr->ptr, &tmp, unsigned(value->type->size));
			return true;
		}

		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprTypeLiteral *expr = getType<ExprTypeLiteral>(value))
	{
		if(isType<TypeError>(expr->value))
			return false;

		if(isType<TypeArgumentSet>(expr->value) || isType<TypeMemberSet>(expr->value))
			return false;

		unsigned index = ctx.ctx.GetTypeIndex(expr->value);
		memcpy(ptr->ptr, &index, unsigned(value->type->size));
		return true;
	}

	if(isType<ExprNullptrLiteral>(value))
	{
		memset(ptr->ptr, 0, unsigned(value->type->size));
		return true;
	}

	if(ExprFunctionIndexLiteral *expr = getType<ExprFunctionIndexLiteral>(value))
	{
		unsigned index = expr->function ? ctx.ctx.GetFunctionIndex(expr->function) + 1 : 0;
		memcpy(ptr->ptr, &index, unsigned(value->type->size));
		return true;
	}

	if(ExprFunctionLiteral *expr = getType<ExprFunctionLiteral>(value))
	{
		unsigned index = expr->data ? ctx.ctx.GetFunctionIndex(expr->data) + 1 : 0;
		memcpy(ptr->ptr, &index, sizeof(unsigned));

		if(isType<ExprNullptrLiteral>(expr->context))
			memset(ptr->ptr + 4, 0, sizeof(void*));
		else if(ExprPointerLiteral *context = getType<ExprPointerLiteral>(expr->context))
			memcpy(ptr->ptr + 4, &context->ptr, sizeof(void*));
		else
			return false;

		return true;
	}

	if(ExprPointerLiteral *expr = getType<ExprPointerLiteral>(value))
	{
		TypeRef *ptrType = getType<TypeRef>(expr->type);

		(void)ptrType;
		assert(ptrType);
		assert(expr->ptr + ptrType->subType->size <= expr->end);

		memcpy(ptr->ptr, &expr->ptr, unsigned(value->type->size));
		return true;
	}

	if(ExprMemoryLiteral *expr = getType<ExprMemoryLiteral>(value))
	{
		memcpy(ptr->ptr, expr->ptr->ptr, unsigned(value->type->size));
		return true;
	}

	Report(ctx, "ERROR: unknown store type");

	return false;
}